

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

ssl_private_key_result_t
AsyncPrivateKeyDecrypt
          (SSL *ssl,uint8_t *out,size_t *out_len,size_t max_out,uint8_t *in,size_t in_len)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  TestState *pTVar4;
  EVP_PKEY *pkey;
  RSA *rsa_00;
  uchar *out_00;
  RSA *rsa;
  EVP_PKEY *private_key;
  TestState *test_state;
  size_t in_len_local;
  uint8_t *in_local;
  size_t max_out_local;
  size_t *out_len_local;
  uint8_t *out_local;
  SSL *ssl_local;
  
  pTVar4 = GetTestState(ssl);
  pTVar4->used_private_key = true;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    (&pTVar4->private_key_result);
  if (!bVar1) {
    fprintf(_stderr,"AsyncPrivateKeyDecrypt called with operation pending.\n");
    abort();
  }
  pkey = GetPrivateKey(ssl);
  rsa_00 = EVP_PKEY_get0_RSA(pkey);
  if (rsa_00 == (RSA *)0x0) {
    fprintf(_stderr,"AsyncPrivateKeyDecrypt called with incorrect key type.\n");
    abort();
  }
  uVar2 = RSA_size((RSA *)rsa_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&pTVar4->private_key_result,(ulong)uVar2);
  out_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&pTVar4->private_key_result);
  uVar2 = RSA_size((RSA *)rsa_00);
  iVar3 = RSA_decrypt(rsa_00,out_len,out_00,(ulong)uVar2,in,in_len,3);
  if (iVar3 == 0) {
    ssl_local._4_4_ = ssl_private_key_failure;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&pTVar4->private_key_result,*out_len);
    ssl_local._4_4_ = AsyncPrivateKeyComplete(ssl,out,out_len,max_out);
  }
  return ssl_local._4_4_;
}

Assistant:

static ssl_private_key_result_t AsyncPrivateKeyDecrypt(SSL *ssl, uint8_t *out,
                                                       size_t *out_len,
                                                       size_t max_out,
                                                       const uint8_t *in,
                                                       size_t in_len) {
  TestState *test_state = GetTestState(ssl);
  test_state->used_private_key = true;
  if (!test_state->private_key_result.empty()) {
    fprintf(stderr, "AsyncPrivateKeyDecrypt called with operation pending.\n");
    abort();
  }

  EVP_PKEY *private_key = GetPrivateKey(ssl);
  RSA *rsa = EVP_PKEY_get0_RSA(private_key);
  if (rsa == NULL) {
    fprintf(stderr, "AsyncPrivateKeyDecrypt called with incorrect key type.\n");
    abort();
  }
  test_state->private_key_result.resize(RSA_size(rsa));
  if (!RSA_decrypt(rsa, out_len, test_state->private_key_result.data(),
                   RSA_size(rsa), in, in_len, RSA_NO_PADDING)) {
    return ssl_private_key_failure;
  }

  test_state->private_key_result.resize(*out_len);

  return AsyncPrivateKeyComplete(ssl, out, out_len, max_out);
}